

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

int __thiscall
libtorrent::aux::piece_picker::add_blocks
          (piece_picker *this,piece_index_t piece,
          typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
          *pieces,vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_>
                  *interesting_blocks,
          vector<libtorrent::piece_block,_std::allocator<libtorrent::piece_block>_> *backup_blocks,
          int num_blocks,int prefer_contiguous_blocks,torrent_peer *peer,
          vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
          *ignore,picker_options_t options)

{
  pointer ppVar1;
  iterator __position;
  int iVar2;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar3;
  int iVar4;
  __normal_iterator<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
  _Var5;
  iterator dp;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> iVar6;
  byte bVar7;
  int iVar8;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __begin3
  ;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar9;
  uint uVar10;
  int local_54;
  piece_index_t k;
  piece_index_t piece_local;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_> __end3;
  
  local_54 = piece.m_val;
  piece_local = piece;
  _Var5 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const>>
                    ((ignore->
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (ignore->
                     super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  if (_Var5._M_current ==
      (ignore->
      super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    ppVar1 = (this->m_piece_map).
             super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             .
             super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = *(uint *)(ppVar1 + piece_local.m_val);
    bVar7 = (byte)(uVar10 >> 0x1a) & 7;
    if (bVar7 == 5) {
      bVar7 = 0;
    }
    else if ((uVar10 >> 0x1a & 7) == 6) {
      bVar7 = 1;
    }
    if (bVar7 == 4) {
      if (piece_local.m_val + 1 ==
          (int)((ulong)((long)(this->m_piece_map).
                              super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                              .
                              super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3)) {
        uVar10 = (uint)this->m_blocks_in_last_piece;
      }
      else {
        iVar2 = this->m_piece_size;
        iVar4 = 0x4000;
        if (iVar2 < 0x4000) {
          iVar4 = iVar2;
        }
        uVar10 = (iVar2 + iVar4 + -1) / iVar4;
      }
      iVar2 = pad_bytes_in_piece(this,piece_local);
      if (prefer_contiguous_blocks == 0) {
        iVar4 = 0x4000;
        if (this->m_piece_size < 0x4000) {
          iVar4 = this->m_piece_size;
        }
        iVar2 = uVar10 - iVar2 / iVar4;
        if (num_blocks <= iVar2) {
          iVar2 = num_blocks;
        }
        local_54 = 0;
        if (0 < iVar2) {
          do {
            ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
            emplace_back<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>&,int&>
                      ((vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>> *)
                       interesting_blocks,&piece_local,&local_54);
            local_54 = local_54 + 1;
          } while (local_54 < iVar2);
        }
        num_blocks = num_blocks - iVar2;
      }
      else {
        iVar6 = expand_piece(this,piece_local,prefer_contiguous_blocks,pieces,options);
        sVar3 = iVar6._end.m_val;
        sVar9.m_val = iVar6._begin.m_val.m_val;
        while (sVar9.m_val != sVar3.m_val) {
          sVar9 = iVar6._begin.m_val;
          local_54 = sVar9.m_val;
          k.m_val = sVar9.m_val;
          _Var5 = ::std::
                  __find_if<__gnu_cxx::__normal_iterator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const*,std::vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const>>
                            ((ignore->
                             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                             (ignore->
                             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish,&local_54);
          __position._M_current =
               (ignore->
               super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (_Var5._M_current == __position._M_current) {
            if (__position._M_current ==
                (ignore->
                super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              ::std::
              vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
              ::
              _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                        ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                          *)ignore,__position,&k);
            }
            else {
              (__position._M_current)->m_val = k.m_val;
              (ignore->
              super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              )._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            if (k.m_val + 1 ==
                (int)((ulong)((long)(this->m_piece_map).
                                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    .
                                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_piece_map).
                                   super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                   .
                                   super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
              uVar10 = (uint)this->m_blocks_in_last_piece;
            }
            else {
              iVar2 = this->m_piece_size;
              iVar4 = 0x4000;
              if (iVar2 < 0x4000) {
                iVar4 = iVar2;
              }
              uVar10 = (iVar2 + iVar4 + -1) / iVar4;
            }
            iVar4 = pad_bytes_in_piece(this,k);
            iVar2 = this->m_piece_size;
            if (0x3fff < iVar2) {
              iVar2 = 0x4000;
            }
            local_54 = 0;
            if (iVar4 / iVar2 < (int)uVar10) {
              do {
                iVar8 = num_blocks;
                ::std::vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>::
                emplace_back<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,int&>
                          ((vector<libtorrent::piece_block,std::allocator<libtorrent::piece_block>>
                            *)interesting_blocks,&k,&local_54);
                if ((prefer_contiguous_blocks == 1) && (iVar8 < 2)) {
                  prefer_contiguous_blocks = 0;
                  break;
                }
                local_54 = local_54 + 1;
                prefer_contiguous_blocks = prefer_contiguous_blocks + -1;
                num_blocks = iVar8 + -1;
              } while (local_54 < (int)(uVar10 - iVar4 / iVar2));
              num_blocks = iVar8 + -1;
            }
            bVar7 = 0;
          }
          else {
            prefer_contiguous_blocks = prefer_contiguous_blocks + -1;
            bVar7 = 0x10 - (num_blocks < 1 && prefer_contiguous_blocks == 0);
            if (num_blocks < 1 && prefer_contiguous_blocks == 0) {
              prefer_contiguous_blocks = 0;
            }
          }
          if ((bVar7 & 0xf) != 0) break;
          iVar6._begin.m_val = sVar9.m_val + 1;
          iVar6._end.m_val = 0;
          sVar9.m_val = iVar6._begin.m_val;
        }
      }
      if (num_blocks < 1) {
        num_blocks = 0;
      }
    }
    else if ((bVar7 == 0) && ((options.m_val & 8) == 0)) {
      dp = find_dl_piece(this,(download_queue_t)0x0,piece_local);
      num_blocks = add_blocks_downloading
                             (this,dp._M_current,pieces,interesting_blocks,backup_blocks,num_blocks,
                              prefer_contiguous_blocks,peer,options);
    }
  }
  return num_blocks;
}

Assistant:

int piece_picker::add_blocks(piece_index_t piece
		, typed_bitfield<piece_index_t> const& pieces
		, std::vector<piece_block>& interesting_blocks
		, std::vector<piece_block>& backup_blocks
		, int num_blocks, int prefer_contiguous_blocks
		, aux::torrent_peer* peer, std::vector<piece_index_t>& ignore
		, picker_options_t const options) const
	{
		TORRENT_ASSERT(is_piece_free(piece, pieces));

		// ignore pieces found in the ignore list
		if (contains(ignore, piece)) return num_blocks;

		auto const state = m_piece_map[piece].download_queue();
		if (state != piece_pos::piece_open
			&& state != piece_pos::piece_downloading)
			return num_blocks;

		TORRENT_ASSERT(m_piece_map[piece].priority(this) >= 0);
		if (state == piece_pos::piece_downloading)
		{
			// if we're prioritizing partials, we've already
			// looked through the downloading pieces
			if (options & prioritize_partials) return num_blocks;

			auto i = find_dl_piece(piece_pos::piece_downloading, piece);
			TORRENT_ASSERT(i != m_downloads[state].end());

			return add_blocks_downloading(*i, pieces
				, interesting_blocks, backup_blocks
				, num_blocks, prefer_contiguous_blocks, peer, options);
		}

		// pick a new piece
		int payload_blocks = blocks_in_piece(piece) - pad_bytes_in_piece(piece) / block_size();

		if (prefer_contiguous_blocks == 0)
		{
			if (payload_blocks > num_blocks)
				payload_blocks = num_blocks;
			TORRENT_ASSERT(is_piece_free(piece, pieces));
			for (int j = 0; j < payload_blocks; ++j)
			{
				TORRENT_ASSERT(j < blocks_in_piece(piece));
				interesting_blocks.emplace_back(piece, j);
			}
			num_blocks -= payload_blocks;
		}
		else
		{
			auto const range = expand_piece(piece, prefer_contiguous_blocks
				, pieces, options);
			for (piece_index_t const k : range)
			{
				if (contains(ignore, k))
				{
					--prefer_contiguous_blocks;
					if (prefer_contiguous_blocks == 0
						&& num_blocks <= 0) break;
					continue;
				}
				ignore.push_back(k);

				TORRENT_ASSERT(m_piece_map[k].priority(this) > 0);
				payload_blocks = blocks_in_piece(k) - pad_bytes_in_piece(k) / block_size();
				TORRENT_ASSERT(is_piece_free(k, pieces));
				for (int j = 0; j < payload_blocks; ++j)
				{
					TORRENT_ASSERT(j < blocks_in_piece(k));
					interesting_blocks.emplace_back(k, j);
					--num_blocks;
					--prefer_contiguous_blocks;
					if (prefer_contiguous_blocks == 0
						&& num_blocks <= 0) break;
				}
			}
		}
#if TORRENT_USE_INVARIANT_CHECKS
		verify_pick(interesting_blocks, pieces);
#endif
		return std::max(num_blocks, 0);
	}